

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::MStep
          (ProductQuantizer *this,real *x0,real *centroids,uint8_t *codes,int32_t d,int32_t n)

{
  real *prVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  byte bVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  real *prVar18;
  pointer piVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  vector<int,_std::allocator<int>_> nelts;
  allocator_type local_81;
  real *local_80;
  ulong local_78;
  long local_70;
  size_t local_68;
  long local_60;
  minstd_rand *local_58;
  value_type_conflict1 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)this->ksub_,&local_4c,&local_81);
  lVar15 = (long)d;
  local_80 = centroids;
  local_60 = lVar15;
  memset(centroids,0,(long)this->ksub_ * lVar15 * 4);
  if (0 < n) {
    uVar16 = 0;
    do {
      bVar2 = codes[uVar16];
      if (0 < d) {
        iVar20 = (uint)bVar2 * d;
        uVar21 = 0;
        do {
          local_80[(long)iVar20 + uVar21] = x0[uVar21] + local_80[(long)iVar20 + uVar21];
          uVar21 = uVar21 + 1;
        } while ((uint)d != uVar21);
      }
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[bVar2] =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[bVar2] + 1;
      uVar16 = uVar16 + 1;
      x0 = x0 + lVar15;
    } while (uVar16 != (uint)n);
  }
  iVar20 = this->ksub_;
  uVar16 = (ulong)iVar20;
  piVar19 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (0 < (long)uVar16) {
    auVar23 = vpbroadcastq_avx512vl();
    uVar21 = 0;
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    prVar18 = local_80;
    do {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar21] != 0 && 0 < d) {
        auVar28._0_4_ =
             (float)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21];
        auVar28._4_4_ = auVar28._0_4_;
        auVar28._8_4_ = auVar28._0_4_;
        auVar28._12_4_ = auVar28._0_4_;
        auVar28._16_4_ = auVar28._0_4_;
        auVar28._20_4_ = auVar28._0_4_;
        auVar28._24_4_ = auVar28._0_4_;
        auVar28._28_4_ = auVar28._0_4_;
        uVar22 = 0;
        do {
          auVar24 = vpbroadcastq_avx512vl();
          auVar25 = vpor_avx2(auVar24,auVar9);
          auVar24 = vpor_avx2(auVar24,auVar10);
          uVar11 = vpcmpuq_avx512vl(auVar24,auVar23,2);
          bVar14 = (byte)uVar11;
          uVar11 = vpcmpuq_avx512vl(auVar25,auVar23,2);
          bVar13 = (byte)uVar11;
          bVar2 = bVar13 << 4;
          prVar1 = prVar18 + uVar22;
          auVar25._4_4_ = (uint)((bVar14 & 2) >> 1) * (int)prVar1[1];
          auVar25._0_4_ = (uint)(bVar14 & 1) * (int)*prVar1;
          auVar25._8_4_ = (uint)((bVar14 & 4) >> 2) * (int)prVar1[2];
          auVar25._12_4_ = (uint)((bVar14 & 0xf) >> 3) * (int)prVar1[3];
          auVar25._16_4_ = (uint)(bVar13 & 1) * (int)prVar1[4];
          auVar25._20_4_ = (uint)(bVar2 >> 5 & 1) * (int)prVar1[5];
          auVar25._24_4_ = (uint)(bVar2 >> 6 & 1) * (int)prVar1[6];
          auVar25._28_4_ = (uint)(bVar2 >> 7) * (int)prVar1[7];
          auVar25 = vdivps_avx(auVar25,auVar28);
          prVar1 = prVar18 + uVar22;
          bVar4 = (bool)((bVar14 & 2) >> 1);
          bVar5 = (bool)((bVar14 & 4) >> 2);
          bVar6 = (bool)((bVar14 & 0xf) >> 3);
          bVar7 = (bool)(bVar2 >> 5 & 1);
          bVar8 = (bool)(bVar2 >> 6 & 1);
          *prVar1 = (real)((uint)(bVar14 & 1) * auVar25._0_4_ |
                          (uint)!(bool)(bVar14 & 1) * (int)*prVar1);
          prVar1[1] = (real)((uint)bVar4 * auVar25._4_4_ | (uint)!bVar4 * (int)prVar1[1]);
          prVar1[2] = (real)((uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * (int)prVar1[2]);
          prVar1[3] = (real)((uint)bVar6 * auVar25._12_4_ | (uint)!bVar6 * (int)prVar1[3]);
          prVar1[4] = (real)((uint)(bVar13 & 1) * auVar25._16_4_ |
                            (uint)!(bool)(bVar13 & 1) * (int)prVar1[4]);
          prVar1[5] = (real)((uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * (int)prVar1[5]);
          prVar1[6] = (real)((uint)bVar8 * auVar25._24_4_ | (uint)!bVar8 * (int)prVar1[6]);
          prVar1[7] = (real)((uint)(bVar2 >> 7) * auVar25._28_4_ |
                            (uint)!(bool)(bVar2 >> 7) * (int)prVar1[7]);
          uVar22 = uVar22 + 8;
        } while ((d + 7U & 0xfffffff8) != uVar22);
      }
      uVar21 = uVar21 + 1;
      prVar18 = prVar18 + lVar15;
    } while (uVar21 != uVar16);
    if (0 < iVar20) {
      local_58 = &this->rng;
      lVar17 = 0;
      prVar18 = local_80;
      local_78 = (ulong)(uint)d;
      local_68 = lVar15 * 4;
      do {
        if (piVar19[lVar17] == 0) {
          iVar20 = 0;
          local_70 = lVar17;
          while( true ) {
            dVar26 = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                               (local_58);
            piVar19 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((dVar26 + 0.0) * (double)(n - this->ksub_) <
                (double)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar20] + -1)) break;
            iVar20 = (iVar20 + 1) % this->ksub_;
          }
          prVar1 = local_80 + iVar20 * (int)local_78;
          memcpy(local_80 + local_70 * local_60,prVar1,local_68);
          if (0 < (int)local_78) {
            lVar15 = 0;
            do {
              auVar27._0_4_ = (float)(int)(((uint)lVar15 & 2) - 1);
              auVar27._8_8_ = in_XMM6_Qb;
              auVar27._4_4_ = in_XMM6_Db;
              auVar12 = vfmadd213ss_fma(ZEXT416((uint)this->eps_),auVar27,
                                        ZEXT416(*(uint *)((long)prVar18 + lVar15 * 2)));
              *(int *)((long)prVar18 + lVar15 * 2) = auVar12._0_4_;
              auVar12 = vfnmadd213ss_fma(ZEXT416((uint)this->eps_),auVar27,
                                         ZEXT416(*(uint *)((long)prVar1 + lVar15 * 2)));
              *(int *)((long)prVar1 + lVar15 * 2) = auVar12._0_4_;
              lVar15 = lVar15 + 2;
            } while ((ulong)(uint)d * 2 != lVar15);
          }
          iVar3 = piVar19[iVar20];
          piVar19[local_70] = iVar3 / 2;
          piVar19[iVar20] = piVar19[iVar20] - iVar3 / 2;
          uVar16 = (ulong)(uint)this->ksub_;
          lVar17 = local_70;
        }
        lVar17 = lVar17 + 1;
        prVar18 = (real *)((long)prVar18 + local_68);
      } while (lVar17 < (int)uVar16);
      goto LAB_00126a65;
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return;
  }
LAB_00126a65:
  operator_delete(piVar19);
  return;
}

Assistant:

void ProductQuantizer::MStep(const real* x0, real* centroids,
                             const uint8_t* codes,
                             int32_t d, int32_t n) {
  std::vector<int32_t> nelts(ksub_, 0);
  memset(centroids, 0, sizeof(real) * d * ksub_);
  const real* x = x0;
  for (auto i = 0; i < n; i++) {
    auto k = codes[i];
    real* c = centroids + k * d;
    for (auto j = 0; j < d; j++) {
      c[j] += x[j];
    }
    nelts[k]++;
    x += d;
  }

  real* c = centroids;
  for (auto k = 0; k < ksub_; k++) {
    real z = (real) nelts[k];
    if (z != 0) {
      for (auto j = 0; j < d; j++) {
        c[j] /= z;
      }
    }
    c += d;
  }

  std::uniform_real_distribution<> runiform(0,1);
  for (auto k = 0; k < ksub_; k++) {
    if (nelts[k] == 0) {
      int32_t m = 0;
      while (runiform(rng) * (n - ksub_) >= nelts[m] - 1) {
        m = (m + 1) % ksub_;
      }
      memcpy(centroids + k * d, centroids + m * d, sizeof(real) * d);
      for (auto j = 0; j < d; j++) {
        int32_t sign = (j % 2) * 2 - 1;
        centroids[k * d + j] += sign * eps_;
        centroids[m * d + j] -= sign * eps_;
      }
      nelts[k] = nelts[m] / 2;
      nelts[m] -= nelts[k];
    }
  }
}